

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

int xmlSchemaGetCanonValueWhtsp
              (xmlSchemaValPtr val,xmlChar **retValue,xmlSchemaWhitespaceValueType ws)

{
  int iVar1;
  xmlChar *pxVar2;
  
  if (ws + ~XML_SCHEMA_WHITESPACE_COLLAPSE < 0xfffffffd ||
      (val == (xmlSchemaValPtr)0x0 || retValue == (xmlChar **)0x0)) {
    return -1;
  }
  *retValue = (xmlChar *)0x0;
  if (val->type == XML_SCHEMAS_NORMSTRING) {
    pxVar2 = (val->value).qname.name;
    if (pxVar2 != (xmlChar *)0x0) {
      if (ws == XML_SCHEMA_WHITESPACE_COLLAPSE) {
        pxVar2 = xmlSchemaCollapseString(pxVar2);
      }
      else {
        pxVar2 = xmlSchemaWhiteSpaceReplace(pxVar2);
      }
      *retValue = pxVar2;
      if (pxVar2 != (xmlChar *)0x0) {
        return 0;
      }
      pxVar2 = xmlStrdup((val->value).qname.name);
      *retValue = pxVar2;
      return 0;
    }
    pxVar2 = "";
    goto LAB_001c5633;
  }
  if (val->type != XML_SCHEMAS_STRING) {
    iVar1 = xmlSchemaGetCanonValue(val,retValue);
    return iVar1;
  }
  pxVar2 = (val->value).qname.name;
  if (pxVar2 == (xmlChar *)0x0) {
    pxVar2 = xmlStrdup("");
LAB_001c5625:
    *retValue = pxVar2;
    if (pxVar2 != (xmlChar *)0x0) {
      return 0;
    }
  }
  else {
    if (ws == XML_SCHEMA_WHITESPACE_REPLACE) {
      pxVar2 = xmlSchemaWhiteSpaceReplace(pxVar2);
      goto LAB_001c5625;
    }
    if (ws == XML_SCHEMA_WHITESPACE_COLLAPSE) {
      pxVar2 = xmlSchemaCollapseString(pxVar2);
      goto LAB_001c5625;
    }
  }
  pxVar2 = (val->value).qname.name;
LAB_001c5633:
  pxVar2 = xmlStrdup(pxVar2);
  *retValue = pxVar2;
  return 0;
}

Assistant:

int
xmlSchemaGetCanonValueWhtsp(xmlSchemaValPtr val,
			    const xmlChar **retValue,
			    xmlSchemaWhitespaceValueType ws)
{
    if ((retValue == NULL) || (val == NULL))
	return (-1);
    if ((ws == XML_SCHEMA_WHITESPACE_UNKNOWN) ||
	(ws > XML_SCHEMA_WHITESPACE_COLLAPSE))
	return (-1);

    *retValue = NULL;
    switch (val->type) {
	case XML_SCHEMAS_STRING:
	    if (val->value.str == NULL)
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "");
	    else if (ws == XML_SCHEMA_WHITESPACE_COLLAPSE)
		*retValue = xmlSchemaCollapseString(val->value.str);
	    else if (ws == XML_SCHEMA_WHITESPACE_REPLACE)
		*retValue = xmlSchemaWhiteSpaceReplace(val->value.str);
	    if ((*retValue) == NULL)
		*retValue = BAD_CAST xmlStrdup(val->value.str);
	    break;
	case XML_SCHEMAS_NORMSTRING:
	    if (val->value.str == NULL)
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "");
	    else {
		if (ws == XML_SCHEMA_WHITESPACE_COLLAPSE)
		    *retValue = xmlSchemaCollapseString(val->value.str);
		else
		    *retValue = xmlSchemaWhiteSpaceReplace(val->value.str);
		if ((*retValue) == NULL)
		    *retValue = BAD_CAST xmlStrdup(val->value.str);
	    }
	    break;
	default:
	    return (xmlSchemaGetCanonValue(val, retValue));
    }
    return (0);
}